

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_compat.c
# Opt level: O0

char * old_create_router_action_spec(CMFormatList format_list,char *function)

{
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  FMFieldList in_RSI;
  long in_RDI;
  int i;
  int count;
  FMStructDescList structs;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 uVar4;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar5;
  int iVar6;
  
  iVar6 = 0;
  while( true ) {
    uVar4 = false;
    if (in_RDI != 0) {
      uVar4 = *(long *)(in_RDI + (long)iVar6 * 0x10) != 0;
    }
    if ((bool)uVar4 == false) break;
    iVar6 = iVar6 + 1;
  }
  pvVar2 = INT_CMmalloc(CONCAT44(iVar6,in_stack_ffffffffffffffe0));
  for (iVar5 = 0; iVar5 < iVar6; iVar5 = iVar5 + 1) {
    *(undefined8 *)((long)pvVar2 + (long)iVar5 * 0x20) =
         *(undefined8 *)(in_RDI + (long)iVar5 * 0x10);
    *(undefined8 *)((long)pvVar2 + (long)iVar5 * 0x20 + 8) =
         *(undefined8 *)(in_RDI + (long)iVar5 * 0x10 + 8);
    iVar1 = struct_size_field_list(in_RSI,(int)((ulong)pvVar2 >> 0x20));
    *(int *)((long)pvVar2 + (long)iVar5 * 0x20 + 0x10) = iVar1;
    *(undefined8 *)((long)pvVar2 + (long)iVar5 * 0x20 + 0x18) = 0;
  }
  *(undefined8 *)((long)pvVar2 + (long)iVar6 * 0x20) = 0;
  *(undefined8 *)((long)pvVar2 + (long)iVar6 * 0x20 + 8) = 0;
  pcVar3 = create_router_action_spec
                     ((FMStructDescList)CONCAT44(iVar6,iVar5),
                      (char *)CONCAT17(uVar4,in_stack_ffffffffffffffd8));
  return pcVar3;
}

Assistant:

extern char *
old_create_router_action_spec(CMFormatList format_list, char *function)
{
    FMStructDescList structs;
    int count = 0, i;
    while (format_list && (format_list[count].format_name != NULL)) count++;
    structs = malloc(sizeof(structs[0]) * (count + 1));
    for (i = 0; i < count; i++) {
	structs[i].format_name = format_list[i].format_name;
	structs[i].field_list = format_list[i].field_list;
	structs[i].struct_size = struct_size_field_list(structs[i].field_list, (int)sizeof(char*));
	structs[i].opt_info = NULL;
    }
    structs[count].format_name = NULL;
    structs[count].field_list = NULL;
    return create_router_action_spec(structs, function);
}